

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualengine.cpp
# Opt level: O0

int __thiscall QualEngine::open(QualEngine *this,char *__file,int __oflag,...)

{
  int iVar1;
  QualSolver *pQVar2;
  SystemError *this_00;
  value_type local_51;
  value_type_conflict1 local_50 [5];
  allocator local_39;
  string local_38 [32];
  Network *local_18;
  Network *nw_local;
  QualEngine *this_local;
  
  local_18 = (Network *)__file;
  nw_local = (Network *)this;
  if (this->engineState != CLOSED) {
    close(this,(int)__file);
  }
  this->network = local_18;
  iVar1 = Network::count(this->network,NODE);
  this->nodeCount = iVar1;
  iVar1 = Network::count(this->network,LINK);
  this->linkCount = iVar1;
  Network::createQualModel(this->network);
  if (this->network->qualModel == (QualModel *)0x0) {
    this->qualSolver = (QualSolver *)0x0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"LTD",&local_39);
    pQVar2 = QualSolver::factory((string *)local_38,this->network);
    this->qualSolver = pQVar2;
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (this->qualSolver == (QualSolver *)0x0) {
      this_00 = (SystemError *)__cxa_allocate_exception(0x30);
      SystemError::SystemError(this_00,8);
      __cxa_throw(this_00,&SystemError::typeinfo,SystemError::~SystemError);
    }
    local_50[0] = 0;
    std::vector<int,_std::allocator<int>_>::resize
              (&this->sortedLinks,(long)this->linkCount,local_50);
    local_51 = '\0';
    std::vector<char,_std::allocator<char>_>::resize
              (&this->flowDirection,(long)this->linkCount,&local_51);
    this->engineState = OPENED;
  }
  return (int)this;
}

Assistant:

void QualEngine::open(Network* nw)
{
    // ... close currently open engine

    if (engineState != QualEngine::CLOSED) close();

    // ... assign network to engine

    network = nw;
    nodeCount = network->count(Element::NODE);
    linkCount = network->count(Element::LINK);

    // ... create a water quality reaction model

    network->createQualModel();

    // ... no quality solver if there's no network quality model

    if ( network->qualModel == nullptr )
    {
        qualSolver = nullptr;
        return;
    }

    // ... create a water quality solver

    qualSolver = QualSolver::factory("LTD", network);
    if (!qualSolver) throw SystemError(SystemError::QUALITY_SOLVER_NOT_OPENED);

    // ... create sorted link & flow direction arrays

    try
    {
	    sortedLinks.resize(linkCount, 0);
        flowDirection.resize(linkCount, 0);
        engineState = QualEngine::OPENED;
    }
    catch (...)
    {
        throw SystemError(SystemError::QUALITY_SOLVER_NOT_OPENED);
    }
}